

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_converter.cpp
# Opt level: O2

void __thiscall dxil_spv::Converter::Impl::push_ags_instruction(Impl *this,CallInst *instruction)

{
  AgsInstruction *pAVar1;
  bool bVar2;
  uint in_EAX;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  ulong uStack_18;
  uint32_t op;
  
  uStack_18 = (ulong)in_EAX;
  bVar2 = get_constant_operand(&instruction->super_Instruction,2,&op);
  if (bVar2) {
    if ((op & 0xf0000000) == 0x50000000) {
      uVar4 = (ulong)op & 0xff;
      uVar3 = op >> 0x18 & 3;
      if (((byte)(uStack_18 >> 0x20) < 0x34) && ((0xfe70000000000U >> ((ulong)op & 0x3f) & 1) != 0))
      {
        (this->shader_analysis).require_subgroups = true;
        (this->shader_analysis).require_wmma = true;
      }
      uVar6 = (this->ags).current_phase;
      if ((uVar3 < uVar6) ||
         ((uVar5 = (this->ags).num_instructions, uVar5 != 0 &&
          ((this->ags).instructions[0].opcode != (uint32_t)uVar4)))) {
        (this->ags).current_phase = 0;
        (this->ags).num_instructions = 0;
        (this->ags).active_read_backdoor = (Value *)0x0;
        uVar5 = 0;
        uVar6 = 0;
      }
      if ((uVar6 == uVar3 || uVar6 + 1 == uVar3) && (uVar5 < 0x15 && uVar3 <= uVar5)) {
        uVar4 = (ulong)uVar3 << 0x20 | uVar4;
        pAVar1 = (this->ags).instructions + uVar5;
        pAVar1->opcode = (int)uVar4;
        pAVar1->phase = (int)(uVar4 >> 0x20);
        (this->ags).instructions[uVar5].immediate = op >> 8 & 0xffff;
        uVar6 = (this->ags).num_instructions;
        (this->ags).backdoor_instructions[uVar6] = instruction;
        (this->ags).num_instructions = uVar6 + 1;
        (this->ags).current_phase = uVar3;
      }
    }
  }
  return;
}

Assistant:

void Converter::Impl::push_ags_instruction(const llvm::CallInst *instruction)
{
	uint32_t op = 0;
	if (!get_constant_operand(instruction, 2, &op))
		return;

	if (!is_ags_magic(op))
		return;

	auto inst = decode_ags_instruction(op);

	switch (inst.opcode)
	{
	case AmdExtD3DShaderIntrinsicsOpcode_WaveMatrixUavLoad:
	case AmdExtD3DShaderIntrinsicsOpcode_WaveMatrixUavStore:
	case AmdExtD3DShaderIntrinsicsOpcode_WaveMatrixCopy:
	case AmdExtD3DShaderIntrinsicsOpcode_WaveMatrixLdsLoad:
	case AmdExtD3DShaderIntrinsicsOpcode_WaveMatrixLdsStore:
	case AmdExtD3DShaderIntrinsicsOpcode_WaveMatrixMulAcc:
	case AmdExtD3DShaderIntrinsicsOpcode_WaveMatrixFill:
	case AmdExtD3DShaderIntrinsicsOpcode_WaveMatrixElementFill:
	case AmdExtD3DShaderIntrinsicsOpcode_WaveMatrixLength:
	case AmdExtD3DShaderIntrinsicsOpcode_WaveMatrixElementExtract:
		shader_analysis.require_subgroups = true;
		shader_analysis.require_wmma = true;
		break;
	}

	// Reset if we're beginning a new instruction sequence.
	// New instruction type, reset.
	if (inst.phase < ags.current_phase ||
	    (ags.num_instructions && inst.opcode != ags.instructions[0].opcode))
	{
		ags.reset();
	}

	if ((inst.phase == ags.current_phase || (inst.phase == ags.current_phase + 1)) &&
	    inst.phase <= ags.num_instructions &&
	    ags.num_instructions < AgsInstruction::MaxInstructions)
	{
		ags.instructions[ags.num_instructions] = inst;
		ags.backdoor_instructions[ags.num_instructions] = instruction;
		ags.num_instructions++;
		ags.current_phase = inst.phase;
	}
}